

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O3

void __thiscall
QtPrivate::QGenericArrayOps<MakefileGenerator::Compiler>::moveAppend
          (QGenericArrayOps<MakefileGenerator::Compiler> *this,Compiler *b,Compiler *e)

{
  Compiler *pCVar1;
  Data *pDVar2;
  char16_t *pcVar3;
  qsizetype qVar4;
  uint uVar5;
  qsizetype qVar6;
  
  if ((b != e) && (b < e)) {
    pCVar1 = (this->super_QArrayDataPointer<MakefileGenerator::Compiler>).ptr;
    qVar6 = (this->super_QArrayDataPointer<MakefileGenerator::Compiler>).size;
    do {
      pDVar2 = (b->variable_in).d.d;
      (b->variable_in).d.d = (Data *)0x0;
      pCVar1[qVar6].variable_in.d.d = pDVar2;
      pcVar3 = (b->variable_in).d.ptr;
      (b->variable_in).d.ptr = (char16_t *)0x0;
      pCVar1[qVar6].variable_in.d.ptr = pcVar3;
      qVar4 = (b->variable_in).d.size;
      (b->variable_in).d.size = 0;
      pCVar1[qVar6].variable_in.d.size = qVar4;
      uVar5 = b->type;
      pCVar1[qVar6].flags = b->flags;
      pCVar1[qVar6].type = uVar5;
      b = b + 1;
      qVar6 = (this->super_QArrayDataPointer<MakefileGenerator::Compiler>).size + 1;
      (this->super_QArrayDataPointer<MakefileGenerator::Compiler>).size = qVar6;
    } while (b < e);
  }
  return;
}

Assistant:

void moveAppend(T *b, T *e)
    {
        Q_ASSERT(this->isMutable() || b == e);
        Q_ASSERT(!this->isShared() || b == e);
        Q_ASSERT(b <= e);
        Q_ASSERT((e - b) <= this->freeSpaceAtEnd());

        if (b == e)
            return;

        T *data = this->begin();
        while (b < e) {
            new (data + this->size) T(std::move(*b));
            ++b;
            ++this->size;
        }
    }